

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namingConventions.cpp
# Opt level: O2

int namingConventions::namingConventionsFunctions
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *inputFiles)

{
  pointer pbVar1;
  pointer pbVar2;
  bool bVar3;
  pointer pbVar4;
  AST *this;
  uint uVar5;
  string *name_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  newVarNames;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  allfunctNames;
  vector<AST_*,_std::allocator<AST_*>_> functionNames;
  vector<Pda_*,_std::allocator<Pda_*>_> functPdas;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  correctfunctNames;
  string name;
  string local_218;
  string local_1f8;
  string local_1d8;
  stringstream stream;
  
  std::__cxx11::stringstream::stringstream((stringstream *)&stream);
  allfunctNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  allfunctNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  allfunctNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  correctfunctNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  correctfunctNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  correctfunctNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  functPdas.super__Vector_base<Pda_*,_std::allocator<Pda_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  functPdas.super__Vector_base<Pda_*,_std::allocator<Pda_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  functPdas.super__Vector_base<Pda_*,_std::allocator<Pda_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pbVar1 = (inputFiles->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar4 = (inputFiles->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; pbVar4 != pbVar1; pbVar4 = pbVar4 + 1) {
    newVarNames.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    newVarNames.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    newVarNames.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this = (AST *)operator_new(8);
    std::__cxx11::string::string((string *)&local_1d8,(string *)pbVar4);
    AST::AST(this,&local_1d8);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f8,"function-name",(allocator<char> *)&name);
    AST::find(&functionNames,this,&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
    for (uVar5 = 0;
        pbVar2 = newVarNames.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
        name_00 = newVarNames.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start,
        (ulong)uVar5 <
        (ulong)((long)functionNames.super__Vector_base<AST_*,_std::allocator<AST_*>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)functionNames.super__Vector_base<AST_*,_std::allocator<AST_*>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3); uVar5 = uVar5 + 1) {
      AST::yield_abi_cxx11_
                (&name,functionNames.super__Vector_base<AST_*,_std::allocator<AST_*>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar5]);
      bVar3 = std::operator==(&name,"true");
      if (((!bVar3) && (bVar3 = std::operator==(&name,"false"), !bVar3)) &&
         (bVar3 = findNameInVector(&allfunctNames,&name), !bVar3)) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&allfunctNames,&name);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&newVarNames,&name);
      }
      std::__cxx11::string::~string((string *)&name);
    }
    for (; name_00 != pbVar2; name_00 = name_00 + 1) {
      name._M_dataplus._M_p = (pointer)makeNamePda(name_00);
      std::vector<Pda*,std::allocator<Pda*>>::emplace_back<Pda*>
                ((vector<Pda*,std::allocator<Pda*>> *)&functPdas,(Pda **)&name);
      std::__cxx11::string::string((string *)&local_218,(string *)name_00);
      correctName(&name,&local_218);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &correctfunctNames,&name);
      std::__cxx11::string::~string((string *)&name);
      std::__cxx11::string::~string((string *)&local_218);
    }
    std::_Vector_base<AST_*,_std::allocator<AST_*>_>::~_Vector_base
              (&functionNames.super__Vector_base<AST_*,_std::allocator<AST_*>_>);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&newVarNames);
  }
  adjustForAllFiles(inputFiles,&allfunctNames,&functPdas,false);
  std::_Vector_base<Pda_*,_std::allocator<Pda_*>_>::~_Vector_base
            (&functPdas.super__Vector_base<Pda_*,_std::allocator<Pda_*>_>);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&correctfunctNames);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&allfunctNames);
  std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
  return 0;
}

Assistant:

int namingConventions::namingConventionsFunctions(const std::vector<std::string> &inputFiles) {
    std::stringstream stream;
    std::vector<std::string> allfunctNames;
    std::vector<std::string> correctfunctNames;
    std::vector<Pda *> functPdas;

    for (const std::string &input: inputFiles) {

        std::vector<std::string> newVarNames;

        AST *ast = new AST(input);
//        ast->toDot("vbn/NamingConvTests/outputs/yeeters.dot");
        std::vector<AST *> functionNames = ast->find("function-name"); // all found functions

        for (unsigned int i = 0; i < functionNames.size(); ++i) {
            std::string name = functionNames[i]->yield();
            if (!(name == "true" || name == "false") && !findNameInVector(allfunctNames, name)) {
                allfunctNames.push_back(name);
                newVarNames.push_back(name);
            }
        }

        for (std::string &oldName: newVarNames) {
            functPdas.emplace_back(makeNamePda(oldName));
            correctfunctNames.push_back(correctName(oldName));
        }
    }
    adjustForAllFiles(inputFiles, allfunctNames, functPdas, false);

    return 0;
}